

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O0

bool __thiscall
loader::anon_unknown_0::pe_reader::section_table::load(section_table *this,istream *is,header *coff)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  type psVar4;
  auto_any_t in_RSI;
  auto_any_t in_RDI;
  section *s;
  bool _foreach_continue329;
  auto_any_t _foreach_end329;
  auto_any_t _foreach_cur329;
  auto_any_t _foreach_col329;
  false_ *in_stack_ffffffffffffff78;
  uint7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  byte bVar5;
  size_type in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  bool in_stack_ffffffffffffffa7;
  __normal_iterator<loader::(anonymous_namespace)::pe_reader::section_*,_std::vector<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>_>
  local_58;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_50;
  __normal_iterator<loader::(anonymous_namespace)::pe_reader::section_*,_std::vector<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>_>
  local_48;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_40;
  vector<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>
  *local_38;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_30;
  undefined8 local_28;
  undefined8 local_20;
  auto_any_t local_10;
  
  local_10 = in_RSI;
  std::fpos<__mbstate_t>::fpos
            ((fpos<__mbstate_t> *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
             (streamoff)in_stack_ffffffffffffff78);
  std::istream::seekg(in_RSI,local_28,local_20);
  std::
  vector<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>
  ::resize((vector<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>
            *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
           in_stack_ffffffffffffff98);
  local_38 = (vector<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>
              *)boost::foreach_detail_::
                contain<std::vector<loader::(anonymous_namespace)::pe_reader::section,std::allocator<loader::(anonymous_namespace)::pe_reader::section>>>
                          ((vector<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>
                            *)in_RSI,
                           (false_ *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  local_30 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
              *)&local_38;
  bVar1 = boost::iostreams::detail::
          indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
          ::can_write(local_30);
  if (!bVar1) {
    local_48._M_current =
         (section *)
         boost::foreach_detail_::
         begin<std::vector<loader::(anonymous_namespace)::pe_reader::section,std::allocator<loader::(anonymous_namespace)::pe_reader::section>>,mpl_::bool_<false>>
                   (in_RSI,(type2type<std::vector<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>,_mpl_::bool_<false>_>
                            *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                    in_stack_ffffffffffffff78);
    local_40 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                *)&local_48;
    bVar1 = boost::iostreams::detail::
            indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
            ::can_write(local_40);
    if (!bVar1) {
      local_58._M_current =
           (section *)
           boost::foreach_detail_::
           end<std::vector<loader::(anonymous_namespace)::pe_reader::section,std::allocator<loader::(anonymous_namespace)::pe_reader::section>>,mpl_::bool_<false>>
                     (in_RSI,(type2type<std::vector<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>,_mpl_::bool_<false>_>
                              *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff78);
      local_50 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                  *)&local_58;
      bVar1 = boost::iostreams::detail::
              indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
              ::can_write(local_50);
      if (!bVar1) {
        bVar1 = true;
        while( true ) {
          bVar5 = 0;
          if ((bVar1 & 1U) != 0) {
            bVar2 = boost::foreach_detail_::
                    done<std::vector<loader::(anonymous_namespace)::pe_reader::section,std::allocator<loader::(anonymous_namespace)::pe_reader::section>>,mpl_::bool_<false>>
                              (in_RDI,in_RSI,
                               (type2type<std::vector<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>,_mpl_::bool_<false>_>
                                *)(ulong)in_stack_ffffffffffffff80);
            bVar5 = bVar2 ^ 0xff;
          }
          if ((bVar5 & 1) == 0) break;
          bVar2 = boost::foreach_detail_::set_false((bool *)&stack0xffffffffffffffa7);
          if (!bVar2) {
            psVar4 = boost::foreach_detail_::
                     deref<std::vector<loader::(anonymous_namespace)::pe_reader::section,std::allocator<loader::(anonymous_namespace)::pe_reader::section>>,mpl_::bool_<false>>
                               ((auto_any_t)CONCAT17(bVar5,in_stack_ffffffffffffff80),
                                (type2type<std::vector<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>,_mpl_::bool_<false>_>
                                 *)in_stack_ffffffffffffff78);
            while (((bVar1 ^ 0xffU) & 1) != 0) {
              std::istream::seekg((long)local_10,8);
              uVar3 = util::load<unsigned_int>((istream *)0x169515);
              psVar4->virtual_size = uVar3;
              uVar3 = util::load<unsigned_int>((istream *)0x169528);
              psVar4->virtual_address = uVar3;
              std::istream::seekg((long)local_10,4);
              uVar3 = util::load<unsigned_int>((istream *)0x169550);
              psVar4->raw_address = uVar3;
              std::istream::seekg((long)local_10,0x10);
              bVar1 = true;
            }
          }
          if ((bVar1 & 1U) != 0) {
            boost::foreach_detail_::
            next<std::vector<loader::(anonymous_namespace)::pe_reader::section,std::allocator<loader::(anonymous_namespace)::pe_reader::section>>,mpl_::bool_<false>>
                      ((auto_any_t)CONCAT17(bVar5,in_stack_ffffffffffffff80),
                       (type2type<std::vector<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>,_mpl_::bool_<false>_>
                        *)in_stack_ffffffffffffff78);
          }
        }
      }
    }
  }
  bVar5 = std::ios::fail();
  return (bool)((bVar5 ^ 0xff) & 1);
}

Assistant:

bool pe_reader::section_table::load(std::istream & is, const header & coff) {
	
	is.seekg(coff.section_table_offset);
	
	sections.resize(coff.nsections);
	
	BOOST_FOREACH(section & s, sections) {
		
		is.seekg(8, std::ios_base::cur); // name
		
		s.virtual_size = util::load<boost::uint32_t>(is);
		s.virtual_address = util::load<boost::uint32_t>(is);
		
		is.seekg(4, std::ios_base::cur); // raw size
		s.raw_address = util::load<boost::uint32_t>(is);
		
		// relocation addr + line number addr + relocation count
		// + line number count + characteristics
		is.seekg(4 + 4 + 2 + 2 + 4, std::ios_base::cur);
		
	}
	
	return !is.fail();
}